

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-assertion-result.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<
          (AssertionResult *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value)

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  Message *in_stack_00000008;
  AssertionResult *in_stack_00000010;
  wstring *wstr;
  Message *in_stack_ffffffffffffffd0;
  wstring local_18 [8];
  
  wstr = local_18;
  Message::Message(in_RSI);
  Message::operator<<(in_stack_ffffffffffffffd0,wstr);
  AppendMessage(in_stack_00000010,in_stack_00000008);
  Message::~Message((Message *)0x160488);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }